

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable.c
# Opt level: O3

uint ares_htable_hash_FNV1a(uchar *key,size_t key_len,uint seed)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = seed ^ 0x811c9dc5;
  if (key_len != 0) {
    sVar2 = 0;
    do {
      uVar1 = (key[sVar2] ^ uVar1) * 0x1000193;
      sVar2 = sVar2 + 1;
    } while (key_len != sVar2);
  }
  return uVar1;
}

Assistant:

unsigned int ares_htable_hash_FNV1a(const unsigned char *key, size_t key_len,
                                    unsigned int seed)
{
  unsigned int hv = seed ^ 2166136261U;
  size_t       i;

  for (i = 0; i < key_len; i++) {
    hv ^= (unsigned int)key[i];
    /* hv *= 16777619 (0x01000193) */
    hv += (hv << 1) + (hv << 4) + (hv << 7) + (hv << 8) + (hv << 24);
  }

  return hv;
}